

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O2

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
::find_adjacent_facets
          (quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
           *this,facet *_facet,size_type f,size_type _skip)

{
  pointer p_Var1;
  pointer puVar2;
  const_iterator __it;
  ulong uVar3;
  ulong uVar4;
  _Fwd_list_node_base *p_Var5;
  ulong uVar6;
  size_type v_1;
  __ireturn_type _Var7;
  value_type local_50;
  
  p_Var1 = (_facet->vertices_).
           super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->vertices_hashes_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  for (uVar3 = 0; uVar6 = this->dimension_, uVar3 < uVar6; uVar3 = uVar3 + 1) {
    if (_skip != uVar3) {
      p_Var5 = p_Var1[uVar3]._M_node + 1;
      puVar2[uVar3] = (unsigned_long)p_Var5;
      uVar4 = uVar4 ^ (ulong)p_Var5;
    }
  }
  for (uVar3 = 0; uVar3 < uVar6; uVar3 = uVar3 + 1) {
    if (_skip != uVar3) {
      local_50.hash_ =
           (this->vertices_hashes_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3] ^ uVar4;
      local_50.facet_ = _facet;
      local_50.f = f;
      local_50.v = uVar3;
      _Var7 = std::__detail::
              _Insert<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_std::__detail::_Identity,_std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((_Insert<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_std::__detail::_Identity,_std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&this->unique_ridges_,&local_50);
      __it.
      super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
      ._M_cur = (_Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                 )_Var7.first.
                  super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                  ._M_cur;
      if (((undefined1  [16])_Var7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        *(size_type *)
         (*(long *)(*(long *)((long)__it.
                                    super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                                    ._M_cur + 8) + 0x18) +
         *(long *)((long)__it.
                         super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                         ._M_cur + 0x18) * 8) = f;
        (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3] =
             *(unsigned_long *)
              ((long)__it.
                     super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                     ._M_cur + 0x10);
        std::
        _Hashtable<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_std::__detail::_Identity,_std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::erase(&(this->unique_ridges_)._M_h,__it);
      }
    }
    uVar6 = this->dimension_;
  }
  return;
}

Assistant:

void
    find_adjacent_facets(facet & _facet,
                         size_type const f,
                         size_type const _skip)
    {
        size_type ridge_hash_ = 0;
        for (size_type v = 0; v < dimension_; ++v) {
            if (v != _skip) {
                ridge_hash_ ^= (vertices_hashes_[v] = point_hash_(std::addressof(*_facet.vertices_[v])));
            }
        }
        for (size_type v = 0; v < dimension_; ++v) {
            if (v != _skip) { // neighbouring facet against apex (_skip-indexed) is known atm
                auto const position = unique_ridges_.insert({_facet, f, v, (ridge_hash_ ^ vertices_hashes_[v])});
                if (!position.second) {
                    ridge const & ridge_ = *position.first;
                    ridge_.facet_.neighbours_[ridge_.v] = f;
                    _facet.neighbours_[v] = ridge_.f;
                    unique_ridges_.erase(position.first);
                }
            }
        }
    }